

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bin2cpp.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  char *__s;
  char cVar1;
  int iVar2;
  size_t sVar3;
  ostream *poVar4;
  string arg_x;
  string filename;
  string filen;
  fstream file;
  fstream outfile;
  string local_490;
  string local_470;
  string local_450;
  string local_430 [16];
  allocator<char> local_220 [528];
  
  if (argc == 4) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_490,argv[3],(allocator<char> *)local_430);
    iVar2 = std::__cxx11::string::compare((char *)&local_490);
    if ((((iVar2 == 0) || (iVar2 = std::__cxx11::string::compare((char *)&local_490), iVar2 == 0))
        || (iVar2 = std::__cxx11::string::compare((char *)&local_490), iVar2 == 0)) ||
       (iVar2 = std::__cxx11::string::compare((char *)&local_490), iVar2 == 0)) {
      std::__cxx11::string::string<std::allocator<char>>((string *)local_430,argv[1],local_220);
      convertFilename(&local_450,local_430);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_430[0]._M_dataplus._M_p != &local_430[0].field_2) {
        operator_delete(local_430[0]._M_dataplus._M_p,local_430[0].field_2._M_allocated_capacity + 1
                       );
      }
      std::fstream::fstream(local_430);
      std::fstream::open((char *)local_430,(_Ios_Openmode)argv[1]);
      cVar1 = std::__basic_file<char>::is_open();
      if (cVar1 == '\0') {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"Error opening file: ",0x14);
        __s = argv[1];
        if (__s == (char *)0x0) {
          std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x107130);
        }
        else {
          sVar3 = strlen(__s);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,__s,sVar3);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\n",1);
      }
      else {
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_470,argv[2],local_220);
        iVar2 = std::__cxx11::string::compare((char *)&local_490);
        if (((iVar2 == 0) || (iVar2 = std::__cxx11::string::compare((char *)&local_490), iVar2 == 0)
            ) || ((iVar2 = std::__cxx11::string::compare((char *)&local_490), iVar2 == 0 ||
                  (iVar2 = std::__cxx11::string::compare((char *)&local_490), iVar2 == 0)))) {
          std::__cxx11::string::append((char *)&local_470);
        }
        std::fstream::fstream(local_220);
        std::fstream::open((string *)local_220,(_Ios_Openmode)&local_470);
        cVar1 = std::__basic_file<char>::is_open();
        if (cVar1 == '\0') {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"Could not open file: ",0x15);
          poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&std::cerr,local_470._M_dataplus._M_p,
                              local_470._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
          std::fstream::close();
        }
        else {
          iVar2 = std::__cxx11::string::compare((char *)&local_490);
          if (iVar2 == 0) {
            outputCpp17(&local_470,(fstream *)local_430,&local_450,(fstream *)local_220);
          }
          else {
            iVar2 = std::__cxx11::string::compare((char *)&local_490);
            if ((iVar2 == 0) ||
               (iVar2 = std::__cxx11::string::compare((char *)&local_490), iVar2 == 0)) {
              outputCpp(&local_470,(fstream *)local_430,&local_450,(fstream *)local_220,&local_490,
                        argv);
            }
            else {
              iVar2 = std::__cxx11::string::compare((char *)&local_490);
              if (iVar2 == 0) {
                outputGo(&local_470,(fstream *)local_430,&local_450,(fstream *)local_220);
              }
            }
          }
        }
        std::fstream::~fstream(local_220);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_470._M_dataplus._M_p != &local_470.field_2) {
          operator_delete(local_470._M_dataplus._M_p,local_470.field_2._M_allocated_capacity + 1);
        }
      }
      std::fstream::~fstream(local_430);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_450._M_dataplus._M_p != &local_450.field_2) {
        operator_delete(local_450._M_dataplus._M_p,local_450.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_490._M_dataplus._M_p != &local_490.field_2) {
        operator_delete(local_490._M_dataplus._M_p,local_490.field_2._M_allocated_capacity + 1);
      }
      return 0;
    }
    std::operator<<((ostream *)&std::cerr,
                    "Invalid language selection please use either c or cpp or cpp17 or go\n");
  }
  else {
    poVar4 = std::operator<<((ostream *)&std::cerr,"Error requires two arguments.\n");
    poVar4 = std::operator<<(poVar4,*argv);
    std::operator<<(poVar4," binarysource outputfile lang\nlang is either c or cpp\n");
  }
  exit(1);
}

Assistant:

int main(int argc, char **argv) {
    if(argc != 4) {
        std::cerr << "Error requires two arguments.\n" << argv[0] << " binarysource outputfile lang\nlang is either c or cpp\n";
        exit(EXIT_FAILURE);
    }
    std::string arg_x = argv[3];
    if(arg_x != "c" && arg_x != "cpp" && arg_x != "cpp17" && arg_x != "go") {
        std::cerr << "Invalid language selection please use either c or cpp or cpp17 or go\n";
        exit(EXIT_FAILURE);
    }
    std::string filen = convertFilename(argv[1]);
    std::fstream file;
    file.open(argv[1], std::ios::in | std::ios::binary);
    if(!file.is_open()) {
        std::cerr << "Error opening file: " << argv[1] << "\n";
        return 0;
    }
    std::string filename=argv[2];
    if(arg_x == "c" || arg_x == "cpp")
    	filename += ".h";
    else if(arg_x == "cpp17")
        filename += ".hpp";
    else if(arg_x == "go")
        filename += ".go";
    
    std::fstream outfile;
    outfile.open(filename, std::ios::out);
    if(!outfile.is_open()) {
        std::cerr << "Could not open file: " << filename << "\n";
        file.close();
        return 0;
    }
    
    if(arg_x == "cpp17") {
        outputCpp17(filename, file, filen, outfile);
    }
    else if(arg_x == "c" || arg_x == "cpp") {
        outputCpp(filename, file, filen, outfile, arg_x, argv);
    }
    else if(arg_x == "go") {
        outputGo(filename, file, filen, outfile);
    }
    return 0;
}